

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::HeapType::HeapType(HeapType *this,Struct *struct_)

{
  undefined8 uVar1;
  HeapTypeInfo *pHVar2;
  HeapType HVar3;
  undefined8 local_28;
  
  pHVar2 = (HeapTypeInfo *)operator_new(0x50);
  pHVar2->isTemp = false;
  pHVar2->isOpen = false;
  pHVar2->share = Unshared;
  pHVar2->supertype = (HeapTypeInfo *)0x0;
  pHVar2->descriptor = (HeapTypeInfo *)0x0;
  pHVar2->described = (HeapTypeInfo *)0x0;
  pHVar2->recGroup = (RecGroupInfo_conflict *)0x0;
  pHVar2->recGroupIndex = 0;
  pHVar2->kind = Struct;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&(pHVar2->field_9).signature,
             &struct_->fields);
  local_28 = pHVar2;
  HVar3 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)&stack0xffffffffffffffd8,
                     (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                      *)struct_);
  uVar1 = local_28;
  this->id = (uintptr_t)HVar3;
  if ((HeapTypeInfo *)local_28 != (HeapTypeInfo *)0x0) {
    anon_unknown_0::HeapTypeInfo::~HeapTypeInfo((HeapTypeInfo *)local_28);
    operator_delete((void *)uVar1,0x50);
    return;
  }
  return;
}

Assistant:

HeapType::HeapType(const Struct& struct_) {
  new (this) HeapType(
    globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(struct_)));
}